

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

function<void_()> * __thiscall
Liby::BlockingQueue<std::function<void_()>_>::pop_front
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  std::mutex::lock(&this->mutex_);
  pop_front_imp(__return_storage_ptr__,this);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

T pop_front() {
        std::lock_guard<std::mutex> G_(mutex_);
        return pop_front_imp();
    }